

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void linearize_store_var(Proc *proc,VariableType *var_type,Pseudo *var_pseudo,VariableType *val_type
                        ,Pseudo *val_pseudo,uint line_number)

{
  _Bool _Var1;
  opcode local_38;
  opcode op;
  uint line_number_local;
  Pseudo *val_pseudo_local;
  VariableType *val_type_local;
  Pseudo *var_pseudo_local;
  VariableType *var_type_local;
  Proc *proc_local;
  
  if (((undefined1  [48])*var_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    indexed_store(proc,var_pseudo,val_pseudo,val_type->type_code);
  }
  else {
    if ((var_type->type_code == RAVI_TVARARGS) || (var_type->type_code == RAVI_TNIL)) {
      __assert_fail("var_type->type_code != RAVI_TVARARGS && var_type->type_code != RAVI_TNIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x6c9,
                    "void linearize_store_var(Proc *, const VariableType *, Pseudo *, const VariableType *, Pseudo *, unsigned int)"
                   );
    }
    _Var1 = is_compatible(var_type,val_type);
    val_pseudo_local = (Pseudo *)val_type;
    if (!_Var1) {
      instruct_totype(proc,val_pseudo,var_type,line_number);
      val_pseudo_local = (Pseudo *)var_type;
    }
    local_38 = op_mov;
    if (var_type->type_code == RAVI_TNUMINT) {
      local_38 = op_movfi;
      if (*(int *)val_pseudo_local == 8) {
        local_38 = op_movi;
      }
    }
    else if ((var_type->type_code == RAVI_TNUMFLT) &&
            (local_38 = op_movif, *(int *)val_pseudo_local == 0x10)) {
      local_38 = op_movf;
    }
    instruct_move(proc,local_38,var_pseudo,val_pseudo,line_number);
  }
  return;
}

Assistant:

static void linearize_store_var(Proc *proc, const VariableType *var_type, Pseudo *var_pseudo,
				const VariableType *val_type, Pseudo *val_pseudo, unsigned line_number)
{
	if (var_pseudo->type == PSEUDO_INDEXED) {
		indexed_store(proc, var_pseudo, val_pseudo, val_type->type_code);
	}
	else {
		assert(var_type->type_code != RAVI_TVARARGS && var_type->type_code != RAVI_TNIL);
		if (!is_compatible(var_type, val_type)) {
			instruct_totype(proc, val_pseudo, var_type, line_number);
			val_type = var_type; // Because of the type assertion!
		}
		enum opcode op = op_mov;
		if (var_type->type_code == RAVI_TNUMINT) {
			op = val_type->type_code == RAVI_TNUMINT ? op_movi : op_movfi;
		} else if (var_type->type_code == RAVI_TNUMFLT) {
			op = val_type->type_code == RAVI_TNUMFLT ? op_movf : op_movif;
		}
		instruct_move(proc, op, var_pseudo, val_pseudo, line_number);
	}
}